

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_hide_and_save_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *pAVar2;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object obj;
  Am_Object *cmd_local;
  
  obj.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_18);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)cmd);
  Am_Object::operator=(&local_18,(Am_Object *)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_38);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x68);
  Am_Object::operator=(&local_38,pAVar2);
  Am_Object::Set((ushort)&local_38,true,0);
  pAVar1 = do_save_file.Call;
  Am_Object::Am_Object(&local_40,(Am_Object *)cmd);
  (*pAVar1)((Am_Object_Data *)&local_40);
  Am_Object::~Am_Object(&local_40);
  if ((dirty & 1U) != 0) {
    Am_Object::Set((ushort)cmd,0x154,0);
  }
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_and_save, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);

  do_save_file.Call(cmd);

  if (dirty)
    cmd.Set(Am_IMPLEMENTATION_PARENT, 0);
}